

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectest-interp.cc
# Opt level: O1

void __thiscall spectest::CommandRunner::CommandRunner(CommandRunner *this)

{
  _Rb_tree_header *p_Var1;
  void *pvVar2;
  _func_void *p_Var3;
  mapped_type *pmVar4;
  Index IVar5;
  long lVar6;
  vector<wabt::Type,_std::allocator<wabt::Type>_> *this_00;
  string import_name;
  anon_struct_72_2_3f8ecaa8 print_funcs [6];
  undefined1 local_558 [32];
  mapped_type *local_538;
  CommandRunner *local_530;
  allocator local_521;
  anon_union_16_6_113bff37_for_Value_0 local_520;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_510;
  pointer local_500;
  undefined **local_4f8;
  undefined4 local_4f0;
  vector<wabt::Type,_std::allocator<wabt::Type>_> local_4e8;
  vector<wabt::Type,_std::allocator<wabt::Type>_> local_4d0;
  RefPtr<wabt::interp::HostFunc> local_4b8;
  _Any_data local_498;
  code *local_488;
  code *pcStack_480;
  FuncType local_478;
  key_type local_438;
  vector<wabt::Type,_std::allocator<wabt::Type>_> local_418;
  vector<wabt::Type,_std::allocator<wabt::Type>_> local_3f8;
  vector<wabt::Type,_std::allocator<wabt::Type>_> local_3d8;
  vector<wabt::Type,_std::allocator<wabt::Type>_> local_3b8;
  vector<wabt::Type,_std::allocator<wabt::Type>_> local_398;
  vector<wabt::Type,_std::allocator<wabt::Type>_> local_378;
  vector<wabt::Type,_std::allocator<wabt::Type>_> local_358;
  vector<wabt::Type,_std::allocator<wabt::Type>_> local_338;
  vector<wabt::Type,_std::allocator<wabt::Type>_> local_318;
  vector<wabt::Type,_std::allocator<wabt::Type>_> local_2f8;
  vector<wabt::Type,_std::allocator<wabt::Type>_> local_2d8;
  vector<wabt::Type,_std::allocator<wabt::Type>_> local_2b8;
  GlobalType local_298;
  GlobalType local_280;
  GlobalType local_268;
  GlobalType local_250;
  undefined1 local_238 [48];
  vector<wabt::Type,_std::allocator<wabt::Type>_> local_208;
  char *local_1f0;
  undefined **local_1e8;
  undefined4 local_1e0;
  vector<wabt::Type,_std::allocator<wabt::Type>_> local_1d8;
  vector<wabt::Type,_std::allocator<wabt::Type>_> local_1c0;
  char *local_1a8;
  undefined **local_1a0;
  undefined4 local_198;
  vector<wabt::Type,_std::allocator<wabt::Type>_> local_190;
  vector<wabt::Type,_std::allocator<wabt::Type>_> local_178;
  char *local_160;
  undefined **local_158;
  undefined4 local_150;
  vector<wabt::Type,_std::allocator<wabt::Type>_> local_148;
  vector<wabt::Type,_std::allocator<wabt::Type>_> local_130;
  char *local_118;
  undefined **local_110;
  undefined4 local_108;
  vector<wabt::Type,_std::allocator<wabt::Type>_> local_100;
  vector<wabt::Type,_std::allocator<wabt::Type>_> local_e8;
  char *local_d0;
  undefined **local_c8;
  undefined4 local_c0;
  vector<wabt::Type,_std::allocator<wabt::Type>_> local_b8;
  vector<wabt::Type,_std::allocator<wabt::Type>_> local_a0;
  MemoryType local_80;
  TableType local_58;
  
  wabt::interp::Store::Store(&this->store_,&s_features);
  p_Var1 = &(this->registry_)._M_t._M_impl.super__Rb_tree_header;
  (this->registry_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->registry_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->registry_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->registry_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->registry_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->instances_)._M_t._M_impl.super__Rb_tree_header;
  (this->instances_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->instances_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->instances_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->instances_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->instances_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->last_instance_)._M_t._M_impl.super__Rb_tree_header;
  (this->last_instance_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->last_instance_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->last_instance_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->last_instance_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->last_instance_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->passed_ = 0;
  this->total_ = 0;
  (this->source_filename_)._M_dataplus._M_p = (pointer)&(this->source_filename_).field_2;
  (this->source_filename_)._M_string_length = 0;
  (this->source_filename_).field_2._M_local_buf[0] = '\0';
  local_530 = this;
  local_238._0_8_ = local_238 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_238,"spectest","");
  local_538 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::interp::RefPtr<wabt::interp::Extern>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::interp::RefPtr<wabt::interp::Extern>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::interp::RefPtr<wabt::interp::Extern>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::interp::RefPtr<wabt::interp::Extern>_>_>_>_>_>_>
              ::operator[](&this->registry_,(key_type *)local_238);
  if ((undefined1 *)local_238._0_8_ != local_238 + 0x10) {
    operator_delete((void *)local_238._0_8_);
  }
  this_00 = (vector<wabt::Type,_std::allocator<wabt::Type>_> *)(local_238 + 0x18);
  local_238._0_8_ = "print";
  local_2d8.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_2d8.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2d8.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_2f8.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_2f8.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2f8.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_238._16_4_ = 0;
  local_238._8_8_ = &PTR__FuncType_00210440;
  std::vector<wabt::Type,_std::allocator<wabt::Type>_>::vector(this_00,&local_2d8);
  std::vector<wabt::Type,_std::allocator<wabt::Type>_>::vector(&local_208,&local_2f8);
  local_1f0 = "print_i32";
  local_318.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_318.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_318.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_318.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)operator_new(4);
  local_318.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_318.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
       super__Vector_impl_data._M_start + 1;
  (local_318.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
   super__Vector_impl_data._M_start)->enum_ = I32;
  local_338.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_338.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_338.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1e0 = 0;
  local_1e8 = &PTR__FuncType_00210440;
  local_318.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_318.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
       super__Vector_impl_data._M_finish;
  std::vector<wabt::Type,_std::allocator<wabt::Type>_>::vector(&local_1d8,&local_318);
  std::vector<wabt::Type,_std::allocator<wabt::Type>_>::vector(&local_1c0,&local_338);
  local_1a8 = "print_f32";
  local_358.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_358.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_358.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_358.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)operator_new(4);
  local_358.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_358.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
       super__Vector_impl_data._M_start + 1;
  (local_358.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
   super__Vector_impl_data._M_start)->enum_ = F32;
  local_378.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_378.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_378.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_198 = 0;
  local_1a0 = &PTR__FuncType_00210440;
  local_358.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_358.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
       super__Vector_impl_data._M_finish;
  std::vector<wabt::Type,_std::allocator<wabt::Type>_>::vector(&local_190,&local_358);
  std::vector<wabt::Type,_std::allocator<wabt::Type>_>::vector(&local_178,&local_378);
  local_160 = "print_f64";
  local_398.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_398.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_398.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_398.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)operator_new(4);
  local_398.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_398.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
       super__Vector_impl_data._M_start + 1;
  (local_398.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
   super__Vector_impl_data._M_start)->enum_ = F64;
  local_3b8.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_3b8.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_3b8.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_150 = 0;
  local_158 = &PTR__FuncType_00210440;
  local_398.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_398.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
       super__Vector_impl_data._M_finish;
  std::vector<wabt::Type,_std::allocator<wabt::Type>_>::vector(&local_148,&local_398);
  std::vector<wabt::Type,_std::allocator<wabt::Type>_>::vector(&local_130,&local_3b8);
  local_118 = "print_i32_f32";
  local_3d8.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_3d8.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_3d8.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_3d8.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)operator_new(8);
  local_3d8.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_3d8.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
       super__Vector_impl_data._M_start + 2;
  *(undefined8 *)
   local_3d8.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
   super__Vector_impl_data._M_start = 0xfffffffdffffffff;
  local_3f8.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_3f8.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_3f8.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_108 = 0;
  local_110 = &PTR__FuncType_00210440;
  local_3d8.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_3d8.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
       super__Vector_impl_data._M_finish;
  std::vector<wabt::Type,_std::allocator<wabt::Type>_>::vector(&local_100,&local_3d8);
  std::vector<wabt::Type,_std::allocator<wabt::Type>_>::vector(&local_e8,&local_3f8);
  local_d0 = "print_f64_f64";
  local_418.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_418.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_418.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_418.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)operator_new(8);
  local_418.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_418.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
       super__Vector_impl_data._M_start + 2;
  *(undefined8 *)
   local_418.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
   super__Vector_impl_data._M_start = 0xfffffffcfffffffc;
  local_2b8.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_2b8.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2b8.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_c0 = 0;
  local_c8 = &PTR__FuncType_00210440;
  local_418.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_418.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
       super__Vector_impl_data._M_finish;
  std::vector<wabt::Type,_std::allocator<wabt::Type>_>::vector(&local_b8,&local_418);
  std::vector<wabt::Type,_std::allocator<wabt::Type>_>::vector(&local_a0,&local_2b8);
  if (local_2b8.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2b8.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_418.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_418.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_3f8.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_3f8.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_3d8.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_3d8.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_3b8.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_3b8.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_398.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_398.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_378.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_378.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_358.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_358.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_338.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_338.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_318.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_318.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_2f8.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2f8.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_2d8.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2d8.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  lVar6 = 0x1b0;
  do {
    wabt::StringPrintf_abi_cxx11_
              ((string *)local_558,"spectest.%s",
               this_00[-1].super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
               super__Vector_impl_data._M_start);
    local_478.super_ExternType.kind =
         *(ExternKind *)
          &this_00[-1].super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
    local_478.super_ExternType._vptr_ExternType = (_func_int **)&PTR__FuncType_00210440;
    std::vector<wabt::Type,_std::allocator<wabt::Type>_>::vector(&local_478.params,this_00);
    std::vector<wabt::Type,_std::allocator<wabt::Type>_>::vector(&local_478.results,this_00 + 1);
    local_520.i64_ = (u64)&local_510;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_520,local_558._0_8_,
               (pointer)(local_558._0_8_ + (long)(Features *)local_558._8_8_));
    local_500 = this_00[-1].super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                super__Vector_impl_data._M_start;
    local_4f0 = *(undefined4 *)
                 &this_00[-1].super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage;
    local_4f8 = &PTR__FuncType_00210440;
    std::vector<wabt::Type,_std::allocator<wabt::Type>_>::vector(&local_4e8,this_00);
    std::vector<wabt::Type,_std::allocator<wabt::Type>_>::vector(&local_4d0,this_00 + 1);
    local_488 = (code *)0x0;
    pcStack_480 = (code *)0x0;
    local_498._M_unused._M_object = (void *)0x0;
    local_498._8_8_ = 0;
    p_Var3 = (_func_void *)operator_new(0x68);
    *(_func_void **)p_Var3 = p_Var3 + 0x10;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_520.i64_ == &local_510) {
      *(u64 *)(p_Var3 + 0x10) =
           CONCAT44(local_510._M_allocated_capacity._4_4_,local_510._M_allocated_capacity._0_4_);
      *(undefined8 *)(p_Var3 + 0x18) = local_510._8_8_;
    }
    else {
      *(u64 *)p_Var3 = local_520.i64_;
      *(u64 *)(p_Var3 + 0x10) =
           CONCAT44(local_510._M_allocated_capacity._4_4_,local_510._M_allocated_capacity._0_4_);
    }
    *(u64 *)(p_Var3 + 8) = CONCAT44(local_520._12_4_,local_520._8_4_);
    local_520._8_4_ = 0;
    local_520._12_4_ = 0;
    local_510._M_allocated_capacity._0_4_ = local_510._M_allocated_capacity._0_4_ & 0xffffff00;
    *(pointer *)(p_Var3 + 0x20) = local_500;
    *(undefined ***)(p_Var3 + 0x28) = &PTR__ExternType_0020ce00;
    *(undefined4 *)(p_Var3 + 0x30) = local_4f0;
    *(undefined ***)(p_Var3 + 0x28) = &PTR__FuncType_00210440;
    local_520.i64_ = (u64)&local_510;
    std::vector<wabt::Type,_std::allocator<wabt::Type>_>::vector
              ((vector<wabt::Type,_std::allocator<wabt::Type>_> *)(p_Var3 + 0x38),&local_4e8);
    std::vector<wabt::Type,_std::allocator<wabt::Type>_>::vector
              ((vector<wabt::Type,_std::allocator<wabt::Type>_> *)(p_Var3 + 0x50),&local_4d0);
    pcStack_480 = std::
                  _Function_handler<wabt::Result_(wabt::interp::Thread_&,_const_std::vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>_&,_std::vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>_&,_wabt::interp::RefPtr<wabt::interp::Trap>_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/tools/spectest-interp.cc:1225:9)>
                  ::_M_invoke;
    local_488 = std::
                _Function_handler<wabt::Result_(wabt::interp::Thread_&,_const_std::vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>_&,_std::vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>_&,_wabt::interp::RefPtr<wabt::interp::Trap>_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/tools/spectest-interp.cc:1225:9)>
                ::_M_manager;
    local_498._M_unused._0_8_ = p_Var3;
    wabt::interp::Store::
    Alloc<wabt::interp::HostFunc,wabt::interp::Store&,wabt::interp::FuncType&,std::function<wabt::Result(wabt::interp::Thread&,std::vector<wabt::interp::Value,std::allocator<wabt::interp::Value>>const&,std::vector<wabt::interp::Value,std::allocator<wabt::interp::Value>>&,wabt::interp::RefPtr<wabt::interp::Trap>*)>&>
              (&local_4b8,&local_530->store_,&local_530->store_,&local_478,
               (function<wabt::Result_(wabt::interp::Thread_&,_const_std::vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>_&,_std::vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>_&,_wabt::interp::RefPtr<wabt::interp::Trap>_*)>
                *)&local_498);
    std::__cxx11::string::string
              ((string *)&local_438,
               (char *)this_00[-1].super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                       _M_impl.super__Vector_impl_data._M_start,&local_521);
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::interp::RefPtr<wabt::interp::Extern>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::interp::RefPtr<wabt::interp::Extern>_>_>_>
             ::operator[](local_538,&local_438);
    pmVar4->obj_ = (Extern *)local_4b8.obj_;
    pmVar4->store_ = local_4b8.store_;
    if (local_4b8.store_ == (Store *)0x0) {
      IVar5 = 0;
    }
    else {
      IVar5 = wabt::interp::Store::CopyRoot(local_4b8.store_,local_4b8.root_index_);
    }
    pmVar4->root_index_ = IVar5;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_438._M_dataplus._M_p != &local_438.field_2) {
      operator_delete(local_438._M_dataplus._M_p);
    }
    if (local_4b8.obj_ != (HostFunc *)0x0) {
      wabt::interp::Store::DeleteRoot(local_4b8.store_,local_4b8.root_index_);
      local_4b8.obj_ = (HostFunc *)0x0;
      local_4b8.store_ = (Store *)0x0;
      local_4b8.root_index_ = 0;
    }
    if (local_488 != (code *)0x0) {
      (*local_488)(&local_498,&local_498,__destroy_functor);
    }
    local_4f8 = &PTR__FuncType_00210440;
    if (local_4d0.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_4d0.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_4e8.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_4e8.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_520.i64_ != &local_510) {
      operator_delete((void *)local_520.i64_);
    }
    local_478.super_ExternType._vptr_ExternType = (_func_int **)&PTR__FuncType_00210440;
    if (local_478.results.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_478.results.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_478.params.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_478.params.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
    if ((Memory *)local_558._0_8_ != (Memory *)(local_558 + 0x10)) {
      operator_delete((void *)local_558._0_8_);
    }
    this_00 = this_00 + 3;
    lVar6 = lVar6 + -0x48;
  } while (lVar6 != 0);
  local_58.super_ExternType.kind = Table;
  local_58.super_ExternType._12_4_ = 0xfffffff0;
  local_58.super_ExternType._vptr_ExternType = (_func_int **)&PTR__ExternType_00210480;
  local_58.limits.initial = 10;
  local_58.limits.max = 0x14;
  local_58.limits.has_max = true;
  local_58.limits.is_shared = false;
  local_58.limits.is_64 = false;
  wabt::interp::Store::Alloc<wabt::interp::Table,wabt::interp::Store&,wabt::interp::TableType&>
            ((RefPtr<wabt::interp::Table> *)local_558,&local_530->store_,&local_530->store_,
             &local_58);
  local_520.i64_ = (u64)&local_510;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_520,"table","");
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::interp::RefPtr<wabt::interp::Extern>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::interp::RefPtr<wabt::interp::Extern>_>_>_>
           ::operator[](local_538,(key_type *)&local_520.v128_);
  pmVar4->obj_ = (Extern *)local_558._0_8_;
  pmVar4->store_ = (Store *)local_558._8_8_;
  if ((Store *)local_558._8_8_ == (Store *)0x0) {
    IVar5 = 0;
  }
  else {
    IVar5 = wabt::interp::Store::CopyRoot((Store *)local_558._8_8_,local_558._16_8_);
  }
  pmVar4->root_index_ = IVar5;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_520.i64_ != &local_510) {
    operator_delete((void *)local_520.i64_);
  }
  if ((Memory *)local_558._0_8_ != (Memory *)0x0) {
    wabt::interp::Store::DeleteRoot((Store *)local_558._8_8_,local_558._16_8_);
    local_558._0_8_ = (Memory *)0x0;
    local_558._8_8_ = (Store *)0x0;
    local_558._16_8_ = 0;
  }
  local_80.super_ExternType.kind = Memory;
  local_80.super_ExternType._vptr_ExternType = (_func_int **)&PTR__ExternType_002104c0;
  local_80.limits.initial = 1;
  local_80.limits.max = 2;
  local_80.limits.has_max = true;
  local_80.limits.is_shared = false;
  local_80.limits.is_64 = false;
  wabt::interp::Store::Alloc<wabt::interp::Memory,wabt::interp::Store&,wabt::interp::MemoryType&>
            ((RefPtr<wabt::interp::Memory> *)local_558,&local_530->store_,&local_530->store_,
             &local_80);
  local_520.i64_ = (u64)&local_510;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_520,"memory","");
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::interp::RefPtr<wabt::interp::Extern>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::interp::RefPtr<wabt::interp::Extern>_>_>_>
           ::operator[](local_538,(key_type *)&local_520.v128_);
  pmVar4->obj_ = (Extern *)local_558._0_8_;
  pmVar4->store_ = (Store *)local_558._8_8_;
  if ((Store *)local_558._8_8_ == (Store *)0x0) {
    IVar5 = 0;
  }
  else {
    IVar5 = wabt::interp::Store::CopyRoot((Store *)local_558._8_8_,local_558._16_8_);
  }
  pmVar4->root_index_ = IVar5;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_520.i64_ != &local_510) {
    operator_delete((void *)local_520.i64_);
  }
  if ((Memory *)local_558._0_8_ != (Memory *)0x0) {
    wabt::interp::Store::DeleteRoot((Store *)local_558._8_8_,local_558._16_8_);
    local_558._0_8_ = (Memory *)0x0;
    local_558._8_8_ = (Store *)0x0;
    local_558._16_8_ = 0;
  }
  local_250.super_ExternType.kind = Global;
  local_250.super_ExternType._vptr_ExternType = (_func_int **)&PTR__ExternType_00210500;
  local_250.super_ExternType._12_4_ = 0xffffffff;
  local_250.mut = Const;
  local_520._12_4_ = 0;
  local_510._M_allocated_capacity._0_4_ = 0xffffffff;
  local_520.i64_._4_4_ = 0;
  local_520._8_4_ = 0;
  local_520.i32_ = 0x29a;
  wabt::interp::Store::
  Alloc<wabt::interp::Global,wabt::interp::Store&,wabt::interp::GlobalType&,wabt::interp::Value&>
            ((RefPtr<wabt::interp::Global> *)local_558,&local_530->store_,&local_530->store_,
             &local_250,(Value *)&local_520.v128_);
  local_520.i64_ = (u64)&local_510;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_520,"global_i32","");
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::interp::RefPtr<wabt::interp::Extern>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::interp::RefPtr<wabt::interp::Extern>_>_>_>
           ::operator[](local_538,(key_type *)&local_520.v128_);
  pmVar4->obj_ = (Extern *)local_558._0_8_;
  pmVar4->store_ = (Store *)local_558._8_8_;
  if ((Store *)local_558._8_8_ == (Store *)0x0) {
    IVar5 = 0;
  }
  else {
    IVar5 = wabt::interp::Store::CopyRoot((Store *)local_558._8_8_,local_558._16_8_);
  }
  pmVar4->root_index_ = IVar5;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_520.i64_ != &local_510) {
    operator_delete((void *)local_520.i64_);
  }
  if ((Memory *)local_558._0_8_ != (Memory *)0x0) {
    wabt::interp::Store::DeleteRoot((Store *)local_558._8_8_,local_558._16_8_);
    local_558._0_8_ = (Memory *)0x0;
    local_558._8_8_ = (Store *)0x0;
    local_558._16_8_ = 0;
  }
  local_268.super_ExternType.kind = Global;
  local_268.super_ExternType._vptr_ExternType = (_func_int **)&PTR__ExternType_00210500;
  local_268.super_ExternType._12_4_ = 0xfffffffe;
  local_268.mut = Const;
  local_520.i32_ = 0x29a;
  local_520.i64_._4_4_ = 0;
  local_520._8_4_ = 0;
  local_520._12_4_ = 0;
  local_510._M_allocated_capacity._0_4_ = 0xfffffffe;
  wabt::interp::Store::
  Alloc<wabt::interp::Global,wabt::interp::Store&,wabt::interp::GlobalType&,wabt::interp::Value&>
            ((RefPtr<wabt::interp::Global> *)local_558,&local_530->store_,&local_530->store_,
             &local_268,(Value *)&local_520.v128_);
  local_520.i64_ = (u64)&local_510;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_520,"global_i64","");
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::interp::RefPtr<wabt::interp::Extern>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::interp::RefPtr<wabt::interp::Extern>_>_>_>
           ::operator[](local_538,(key_type *)&local_520.v128_);
  pmVar4->obj_ = (Extern *)local_558._0_8_;
  pmVar4->store_ = (Store *)local_558._8_8_;
  if ((Store *)local_558._8_8_ == (Store *)0x0) {
    IVar5 = 0;
  }
  else {
    IVar5 = wabt::interp::Store::CopyRoot((Store *)local_558._8_8_,local_558._16_8_);
  }
  pmVar4->root_index_ = IVar5;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_520.i64_ != &local_510) {
    operator_delete((void *)local_520.i64_);
  }
  if ((Memory *)local_558._0_8_ != (Memory *)0x0) {
    wabt::interp::Store::DeleteRoot((Store *)local_558._8_8_,local_558._16_8_);
    local_558._0_8_ = (Memory *)0x0;
    local_558._8_8_ = (Store *)0x0;
    local_558._16_8_ = 0;
  }
  local_280.super_ExternType.kind = Global;
  local_280.super_ExternType._vptr_ExternType = (_func_int **)&PTR__ExternType_00210500;
  local_280.super_ExternType._12_4_ = 0xfffffffd;
  local_280.mut = Const;
  local_520._12_4_ = 0;
  local_510._M_allocated_capacity._0_4_ = 0xfffffffd;
  local_520.i64_._4_4_ = 0;
  local_520._8_4_ = 0;
  local_520.i32_ = 0x44268000;
  wabt::interp::Store::
  Alloc<wabt::interp::Global,wabt::interp::Store&,wabt::interp::GlobalType&,wabt::interp::Value&>
            ((RefPtr<wabt::interp::Global> *)local_558,&local_530->store_,&local_530->store_,
             &local_280,(Value *)&local_520.v128_);
  local_520.i64_ = (u64)&local_510;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_520,"global_f32","");
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::interp::RefPtr<wabt::interp::Extern>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::interp::RefPtr<wabt::interp::Extern>_>_>_>
           ::operator[](local_538,(key_type *)&local_520.v128_);
  pmVar4->obj_ = (Extern *)local_558._0_8_;
  pmVar4->store_ = (Store *)local_558._8_8_;
  if ((Store *)local_558._8_8_ == (Store *)0x0) {
    IVar5 = 0;
  }
  else {
    IVar5 = wabt::interp::Store::CopyRoot((Store *)local_558._8_8_,local_558._16_8_);
  }
  pmVar4->root_index_ = IVar5;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_520.i64_ != &local_510) {
    operator_delete((void *)local_520.i64_);
  }
  if ((Memory *)local_558._0_8_ != (Memory *)0x0) {
    wabt::interp::Store::DeleteRoot((Store *)local_558._8_8_,local_558._16_8_);
    local_558._0_8_ = (Memory *)0x0;
    local_558._8_8_ = (Store *)0x0;
    local_558._16_8_ = 0;
  }
  local_298.super_ExternType.kind = Global;
  local_298.super_ExternType._vptr_ExternType = (_func_int **)&PTR__ExternType_00210500;
  local_298.super_ExternType._12_4_ = 0xfffffffc;
  local_298.mut = Const;
  local_520.i32_ = 0;
  local_520.i64_._4_4_ = 0x4084d000;
  local_520._8_4_ = 0;
  local_520._12_4_ = 0;
  local_510._M_allocated_capacity._0_4_ = 0xfffffffc;
  wabt::interp::Store::
  Alloc<wabt::interp::Global,wabt::interp::Store&,wabt::interp::GlobalType&,wabt::interp::Value&>
            ((RefPtr<wabt::interp::Global> *)local_558,&local_530->store_,&local_530->store_,
             &local_298,(Value *)&local_520.v128_);
  local_520.i64_ = (u64)&local_510;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_520,"global_f64","");
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::interp::RefPtr<wabt::interp::Extern>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::interp::RefPtr<wabt::interp::Extern>_>_>_>
           ::operator[](local_538,(key_type *)&local_520.v128_);
  pmVar4->obj_ = (Extern *)local_558._0_8_;
  pmVar4->store_ = (Store *)local_558._8_8_;
  if ((Store *)local_558._8_8_ == (Store *)0x0) {
    IVar5 = 0;
  }
  else {
    IVar5 = wabt::interp::Store::CopyRoot((Store *)local_558._8_8_,local_558._16_8_);
  }
  pmVar4->root_index_ = IVar5;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_520.i64_ != &local_510) {
    operator_delete((void *)local_520.i64_);
  }
  if ((Memory *)local_558._0_8_ != (Memory *)0x0) {
    wabt::interp::Store::DeleteRoot((Store *)local_558._8_8_,local_558._16_8_);
    local_558._0_8_ = (Memory *)0x0;
    local_558._8_8_ = (Store *)0x0;
    local_558._16_8_ = 0;
  }
  lVar6 = 0x1b0;
  do {
    *(undefined ***)((long)&local_280.super_ExternType.kind + lVar6) = &PTR__FuncType_00210440;
    pvVar2 = *(void **)((long)&local_250.super_ExternType._vptr_ExternType + lVar6);
    if (pvVar2 != (void *)0x0) {
      operator_delete(pvVar2);
    }
    pvVar2 = *(void **)((long)&local_268.super_ExternType._vptr_ExternType + lVar6);
    if (pvVar2 != (void *)0x0) {
      operator_delete(pvVar2);
    }
    lVar6 = lVar6 + -0x48;
  } while (lVar6 != 0);
  return;
}

Assistant:

CommandRunner::CommandRunner() : store_(s_features) {
  auto&& spectest = registry_["spectest"];

  // Initialize print functions for the spec test.
  struct {
    const char* name;
    interp::FuncType type;
  } const print_funcs[] = {
      {"print", interp::FuncType{{}, {}}},
      {"print_i32", interp::FuncType{{ValueType::I32}, {}}},
      {"print_f32", interp::FuncType{{ValueType::F32}, {}}},
      {"print_f64", interp::FuncType{{ValueType::F64}, {}}},
      {"print_i32_f32", interp::FuncType{{ValueType::I32, ValueType::F32}, {}}},
      {"print_f64_f64", interp::FuncType{{ValueType::F64, ValueType::F64}, {}}},
  };

  for (auto&& print : print_funcs) {
    auto import_name = StringPrintf("spectest.%s", print.name);
    spectest[print.name] = HostFunc::New(
        store_, print.type,
        [=](Thread& inst, const Values& params, Values& results,
            Trap::Ptr* trap) -> wabt::Result {
          printf("called host ");
          WriteCall(s_stdout_stream.get(), import_name, print.type, params,
                    results, *trap);
          return wabt::Result::Ok;
        });
  }

  spectest["table"] =
      interp::Table::New(store_, TableType{ValueType::FuncRef, Limits{10, 20}});

  spectest["memory"] = interp::Memory::New(store_, MemoryType{Limits{1, 2}});

  spectest["global_i32"] = interp::Global::New(
      store_, GlobalType{ValueType::I32, Mutability::Const}, Value::Make(u32{666}));
  spectest["global_i64"] = interp::Global::New(
      store_, GlobalType{ValueType::I64, Mutability::Const}, Value::Make(u64{666}));
  spectest["global_f32"] = interp::Global::New(
      store_, GlobalType{ValueType::F32, Mutability::Const}, Value::Make(f32{666}));
  spectest["global_f64"] = interp::Global::New(
      store_, GlobalType{ValueType::F64, Mutability::Const}, Value::Make(f64{666}));
}